

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

shared_ptr<miniros::master::HostInfo> __thiscall
miniros::master::AddressResolver::updateHost(AddressResolver *this,RequesterInfo *requesterInfo)

{
  _Base_ptr p_Var1;
  byte bVar2;
  bool bVar3;
  Type TVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long in_RSI;
  element_type *in_RDI;
  byte bVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_const_iterator<miniros::network::NetAddress>,_bool> pVar10;
  shared_ptr<miniros::master::HostInfo> sVar11;
  iterator it;
  iterator it_1;
  scoped_lock<std::mutex> lock;
  bool isSameMachine;
  bool isIP;
  URL url;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
  *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
  in_stack_fffffffffffffe58;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *in_stack_fffffffffffffe60;
  allocator<char> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  _Self local_108;
  _Self local_100;
  undefined4 local_f4;
  _Self local_f0;
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [7];
  string *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined4 in_stack_ffffffffffffff54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [5];
  
  uVar5 = ::std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    ::std::shared_ptr<miniros::master::HostInfo>::shared_ptr
              ((shared_ptr<miniros::master::HostInfo> *)0x54bb0a);
    _Var7._M_pi = extraout_RDX;
    goto LAB_0054bf2b;
  }
  network::URL::URL((URL *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  p_Var1 = _local_c0;
  uVar5 = (ulong)_local_c0 >> 0x38;
  network::URL::fromString
            ((URL *)CONCAT44(in_stack_ffffffffffffff54,
                             CONCAT13(in_stack_ffffffffffffff53,
                                      CONCAT12(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50))
                            ),in_stack_ffffffffffffff48,SUB81(uVar5,0));
  _local_c0 = p_Var1;
  TVar4 = network::NetAddress::checkAddressType(in_stack_fffffffffffffe48);
  bVar8 = TVar4 != AddressInvalid;
  bVar2 = network::NetAddress::isLocal
                    ((NetAddress *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (mutex_type *)in_stack_fffffffffffffe38);
  if ((bVar8 & 1) == 0) {
    local_100._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
         ::find(in_stack_fffffffffffffe38,(key_type *)0x54bd25);
    local_108._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
         ::end(in_stack_fffffffffffffe38);
    bVar3 = ::std::operator==(&local_100,&local_108);
    if (bVar3) {
      in_stack_fffffffffffffe60 =
           (set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
            *)(in_RSI + 0x38);
      ::std::make_shared<miniros::master::HostInfo,std::__cxx11::string&>(local_a0);
      pVar9 = ::std::
              map<std::__cxx11::string,std::shared_ptr<miniros::master::HostInfo>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
              ::emplace<std::__cxx11::string&,std::shared_ptr<miniros::master::HostInfo>>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48,
                         (shared_ptr<miniros::master::HostInfo> *)
                         CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      in_stack_fffffffffffffe58 = pVar9.first._M_node;
      local_100._M_node = in_stack_fffffffffffffe58._M_node;
      ::std::shared_ptr<miniros::master::HostInfo>::~shared_ptr
                ((shared_ptr<miniros::master::HostInfo> *)0x54be0c);
    }
    if ((bVar2 & 1) == 0) {
      ::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
                    *)0x54be64);
      ::std::
      __shared_ptr_access<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x54be70);
      pVar10 = ::std::
               set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
               ::insert(in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58._M_node);
      in_stack_fffffffffffffe47 = pVar10.second;
    }
    else {
      ::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
                    *)0x54beba);
      peVar6 = ::std::
               __shared_ptr_access<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x54bec6);
      peVar6->local = true;
    }
    ::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
                  *)0x54bed7);
    ::std::shared_ptr<miniros::master::HostInfo>::shared_ptr
              ((shared_ptr<miniros::master::HostInfo> *)
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (shared_ptr<miniros::master::HostInfo> *)in_stack_fffffffffffffe38);
  }
  else {
    if ((bVar2 & 1) != 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x38)
      ;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      _local_c0 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
                  ::find(in_stack_fffffffffffffe38,(key_type *)0x54bc01);
      ::std::__cxx11::string::~string(local_e0);
      ::std::allocator<char>::~allocator(&local_e1);
      local_f0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
           ::end(in_stack_fffffffffffffe38);
      bVar3 = ::std::operator!=((_Self *)(local_e0 + 0x20),&local_f0);
      if (bVar3) {
        ::std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>
                      *)0x54bc70);
        ::std::shared_ptr<miniros::master::HostInfo>::shared_ptr
                  ((shared_ptr<miniros::master::HostInfo> *)
                   CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (shared_ptr<miniros::master::HostInfo> *)in_stack_fffffffffffffe38);
        goto LAB_0054bef3;
      }
    }
    ::std::shared_ptr<miniros::master::HostInfo>::shared_ptr
              ((shared_ptr<miniros::master::HostInfo> *)0x54bcff);
  }
LAB_0054bef3:
  local_f4 = 1;
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x54bf00);
  network::URL::~URL((URL *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  _Var7._M_pi = extraout_RDX_00;
LAB_0054bf2b:
  sVar11.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var7._M_pi;
  sVar11.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<miniros::master::HostInfo>)
         sVar11.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HostInfo> AddressResolver::updateHost(const  RequesterInfo& requesterInfo)
{
  if (requesterInfo.callerApi.empty())
    return {};

  network::URL url;
  url.fromString(requesterInfo.callerApi, /*defaultPort*/false);

  // Host can contain either hostname or direct IP address.
  // We should try to make sure that m_hosts[host] points to the same object for both hostname and IP.

  // check if we got a direct IP address instead of a string hostname.
  bool isIP = network::NetAddress::checkAddressType(url.host) != network::NetAddress::AddressInvalid;
  bool isSameMachine = requesterInfo.clientAddress.isLocal();

  std::scoped_lock lock(m_mutex);

  if (isIP) {
    if (isSameMachine) {
      auto it = m_hosts.find("localhost");
      if (it != m_hosts.end())
        return it->second;
    }
    // TODO: find host which corresponds to client IP.
    return {};
  }

  auto it = m_hosts.find(url.host);
  if (it == m_hosts.end()) {
    // Avahi or similar DNS services can provide an alias for some host. Suppose we have some host="rpi.robot". Avahi
    // will provide DNS for "rpi.robot.local" hostname. Some users can force usage of Avahi hostname by specifying
    // ROS_HOSTNAME=rpi.robot.local. We should make sure this alias is points to the same HostInfo object.

    // In the same time, we should be ready that some hosts can have their DHCP ip addresses reassigned.
    // TODO: Check if this IP is already used.
    it = m_hosts.emplace(url.host, std::make_shared<HostInfo>(url.host)).first;
  }

  if (!isSameMachine)
    it->second->addresses.insert((requesterInfo.clientAddress));
  else
    it->second->local = true;

  return it->second;
}